

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_set_negotiated_protocol(ptls_t *tls,char *protocol,size_t protocol_len)

{
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  char *duped;
  void *local_28;
  size_t local_20;
  
  local_28 = (void *)0x0;
  if (in_RSI != (char *)0x0) {
    local_20 = in_RDX;
    if (in_RDX == 0) {
      local_20 = strlen(in_RSI);
    }
    local_28 = malloc(local_20 + 1);
    if (local_28 == (void *)0x0) {
      return 0x201;
    }
    memcpy(local_28,in_RSI,local_20);
    *(undefined1 *)((long)local_28 + local_20) = 0;
  }
  free(*(void **)(in_RDI + 0x110));
  *(void **)(in_RDI + 0x110) = local_28;
  return 0;
}

Assistant:

int ptls_set_negotiated_protocol(ptls_t *tls, const char *protocol, size_t protocol_len)
{
    char *duped = NULL;

    if (protocol != NULL) {
        if (protocol_len == 0)
            protocol_len = strlen(protocol);
        if ((duped = malloc(protocol_len + 1)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(duped, protocol, protocol_len);
        duped[protocol_len] = '\0';
    }

    free(tls->negotiated_protocol);
    tls->negotiated_protocol = duped;

    return 0;
}